

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

string * __thiscall
inja::Parser::load_file_abi_cxx11_(string *__return_storage_ptr__,Parser *this,string_view filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_289;
  undefined1 local_288 [12];
  undefined1 local_278 [12];
  undefined1 local_265;
  allocator<char> local_251;
  string local_250;
  inja local_230 [8];
  ifstream file;
  Parser *this_local;
  string_view filename_local;
  string *text;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (Parser *)filename._M_len;
  filename_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_250,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_251);
  open_file_or_throw(local_230,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  local_265 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_278,
             (istream_type *)local_230);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_288);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_278._0_8_;
  __beg._M_c = local_278._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_288._0_8_;
  __end._M_c = local_288._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_289);
  std::allocator<char>::~allocator(&local_289);
  local_265 = 1;
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(nonstd::string_view filename) {
    std::ifstream file = open_file_or_throw(static_cast<std::string>(filename));
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }